

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatabuffer_p.h
# Opt level: O0

void __thiscall QDataBuffer<QT_FT_Vector_>::reserve(QDataBuffer<QT_FT_Vector_> *this,qsizetype size)

{
  void *pvVar1;
  size_t in_RSI;
  long *in_RDI;
  qsizetype *unaff_retaddr;
  
  if (*in_RDI < (long)in_RSI) {
    if (*in_RDI == 0) {
      *in_RDI = 1;
    }
    while (*in_RDI < (long)in_RSI) {
      *in_RDI = *in_RDI << 1;
    }
    pvVar1 = QtPrivate::fittedRealloc(this,size,unaff_retaddr,(size_t)in_RDI,in_RSI);
    in_RDI[2] = (long)pvVar1;
    qt_noop();
  }
  return;
}

Assistant:

void reserve(qsizetype size) {
        if (size > capacity) {
            if (capacity == 0)
                capacity = 1;
            while (capacity < size)
                capacity *= 2;
            buffer = (Type*) QtPrivate::fittedRealloc(static_cast<void*>(buffer), 0, &capacity, sizeof(Type));
            Q_CHECK_PTR(buffer);
        }
    }